

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dialer.c
# Opt level: O2

int nni_dialer_init(nni_dialer *d,nni_sock *s,nni_sp_tran *tran)

{
  nni_stat_item *item;
  int iVar1;
  uint32_t id;
  long lVar2;
  nni_sp_dialer_ops *pnVar3;
  nni_dialer *pnVar4;
  byte bVar5;
  
  bVar5 = 0;
  d->d_closed = false;
  d->d_data = (void *)0x0;
  d->d_ref = 1;
  d->d_sock = s;
  d->d_tran = tran;
  d->d_inirtime = 10;
  d->d_maxrtime = 1000;
  d->d_currtime = 10;
  nni_atomic_flag_reset(&d->d_started);
  pnVar3 = tran->tran_dialer;
  pnVar4 = d;
  for (lVar2 = 0xb; lVar2 != 0; lVar2 = lVar2 + -1) {
    (pnVar4->d_ops).d_size = pnVar3->d_size;
    pnVar3 = (nni_sp_dialer_ops *)((long)pnVar3 + (ulong)bVar5 * -0x10 + 8);
    pnVar4 = (nni_dialer *)((long)pnVar4 + (ulong)bVar5 * -0x10 + 8);
  }
  (d->d_node).ln_next = (nni_list_node *)0x0;
  (d->d_node).ln_prev = (nni_list_node *)0x0;
  nni_list_init_offset(&d->d_pipes,0xa8);
  nni_mtx_init(&d->d_mtx);
  d->d_data = d + 1;
  nni_aio_init(&d->d_con_aio,dialer_connect_cb,d);
  nni_aio_init(&d->d_tmo_aio,dialer_timer_cb,d);
  item = &d->st_root;
  nni_stat_init(item,(nni_stat_info *)dialer_stats_init_root_info);
  dialer_stat_init(d,&d->st_id,(nni_stat_info *)dialer_stats_init_id_info);
  dialer_stat_init(d,&d->st_sock,(nni_stat_info *)dialer_stats_init_socket_info);
  dialer_stat_init(d,&d->st_pipes,(nni_stat_info *)dialer_stats_init_pipes_info);
  dialer_stat_init(d,&d->st_connect,(nni_stat_info *)dialer_stats_init_connect_info);
  dialer_stat_init(d,&d->st_refused,(nni_stat_info *)dialer_stats_init_refused_info);
  dialer_stat_init(d,&d->st_disconnect,(nni_stat_info *)dialer_stats_init_disconnect_info);
  dialer_stat_init(d,&d->st_canceled,(nni_stat_info *)dialer_stats_init_canceled_info);
  dialer_stat_init(d,&d->st_other,(nni_stat_info *)dialer_stats_init_other_info);
  dialer_stat_init(d,&d->st_timeout,(nni_stat_info *)dialer_stats_init_timeout_info);
  dialer_stat_init(d,&d->st_proto,(nni_stat_info *)dialer_stats_init_proto_info);
  dialer_stat_init(d,&d->st_auth,(nni_stat_info *)dialer_stats_init_auth_info);
  dialer_stat_init(d,&d->st_oom,(nni_stat_info *)dialer_stats_init_oom_info);
  dialer_stat_init(d,&d->st_reject,(nni_stat_info *)dialer_stats_init_reject_info);
  iVar1 = (*(d->d_ops).d_init)(d + 1,&d->d_url,d);
  if ((iVar1 == 0) && (iVar1 = nni_sock_add_dialer(s,d), iVar1 == 0)) {
    nni_mtx_lock(&dialers_lk);
    iVar1 = nni_id_alloc32(&dialers,&d->d_id,d);
    nni_mtx_unlock(&dialers_lk);
    if (iVar1 == 0) {
      nni_stat_set_id(item,d->d_id);
      nni_stat_set_id(&d->st_id,d->d_id);
      id = nni_sock_id(d->d_sock);
      nni_stat_set_id(&d->st_sock,id);
      nni_stat_register(item);
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

static int
nni_dialer_init(nni_dialer *d, nni_sock *s, nni_sp_tran *tran)
{
	int   rv;
	void *dp;

	d->d_closed   = false;
	d->d_data     = NULL;
	d->d_ref      = 1;
	d->d_sock     = s;
	d->d_tran     = tran;
	d->d_inirtime = NNI_SECOND / 100; // 10ms
	d->d_maxrtime = NNI_SECOND;
	d->d_currtime = d->d_inirtime;
	nni_atomic_flag_reset(&d->d_started);

	// Make a copy of the endpoint operations.  This allows us to
	// modify them (to override NULLs for example), and avoids an extra
	// dereference on hot paths.
	d->d_ops = *tran->tran_dialer;

	NNI_LIST_NODE_INIT(&d->d_node);
	NNI_LIST_INIT(&d->d_pipes, nni_pipe, p_ep_node);

	nni_mtx_init(&d->d_mtx);

	d->d_data = ((uint8_t *) d) + NNI_ALIGN_UP(sizeof(*d));
	dp        = d->d_data;

	nni_aio_init(&d->d_con_aio, dialer_connect_cb, d);
	nni_aio_init(&d->d_tmo_aio, dialer_timer_cb, d);

	dialer_stats_init(d);

	rv = d->d_ops.d_init(dp, &d->d_url, d);

	if (rv == 0) {
		rv = nni_sock_add_dialer(s, d);
	}

	if (rv == 0) {
		nni_mtx_lock(&dialers_lk);
		rv = nni_id_alloc32(&dialers, &d->d_id, d);
		nni_mtx_unlock(&dialers_lk);
	}

	if (rv == 0) {
		dialer_register_stats(d);
	}

	return (rv);
}